

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_MuxStructDump_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Str_t *vStr)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  char local_48 [24];
  
  if ((pObj->field_0x3 & 0x40) == 0) {
    return;
  }
  uVar6 = vStr->nCap;
  if (vStr->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar7;
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_007d7e9f;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar8);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar8);
      }
      vStr->pArray = pcVar7;
    }
    vStr->nCap = (int)sVar8;
  }
LAB_007d7e9f:
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  vStr->pArray[iVar2] = '[';
  uVar6 = vStr->nCap;
  if (vStr->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_007d7f0e;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar8);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar7;
    vStr->nCap = (int)sVar8;
  }
LAB_007d7f0e:
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  vStr->pArray[iVar2] = '(';
  uVar6 = 0xffffffff;
  if (p->pMuxes != (uint *)0x0) {
    pGVar4 = p->pObjs;
    if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_007d83b8;
    uVar3 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555];
    if (uVar3 != 0) {
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar6 = uVar3 >> 1;
    }
  }
  if (uVar6 == 0) {
    uVar6 = vStr->nCap;
    if (vStr->nSize == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar8 = 0x10;
      }
      else {
        sVar8 = (ulong)uVar6 * 2;
        if ((int)sVar8 <= (int)uVar6) goto LAB_007d803d;
        if (vStr->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar8);
        }
        else {
          pcVar7 = (char *)realloc(vStr->pArray,sVar8);
        }
      }
      vStr->pArray = pcVar7;
      vStr->nCap = (int)sVar8;
    }
LAB_007d803d:
    iVar2 = vStr->nSize;
    vStr->nSize = iVar2 + 1;
    vStr->pArray[iVar2] = '0';
  }
  else {
    if ((int)uVar6 < 0) {
      uVar3 = vStr->nCap;
      if (vStr->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar3 * 2;
          if ((int)sVar8 <= (int)uVar3) goto LAB_007d806b;
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar8);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,sVar8);
          }
        }
        vStr->pArray = pcVar7;
        vStr->nCap = (int)sVar8;
      }
LAB_007d806b:
      iVar2 = vStr->nSize;
      vStr->nSize = iVar2 + 1;
      vStr->pArray[iVar2] = '-';
      uVar6 = -uVar6;
    }
    uVar9 = 0xffffffffffffffff;
    do {
      local_48[uVar9 + 1] = (char)uVar6 + (char)(uVar6 / 10) * -10;
      uVar9 = uVar9 + 1;
      bVar5 = 9 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar5);
    do {
      cVar1 = local_48[uVar9 & 0xffffffff];
      uVar6 = vStr->nCap;
      if (vStr->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar6 * 2;
          if ((int)sVar8 <= (int)uVar6) goto LAB_007d811a;
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar8);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,sVar8);
          }
        }
        vStr->pArray = pcVar7;
        vStr->nCap = (int)sVar8;
      }
LAB_007d811a:
      iVar2 = vStr->nSize;
      vStr->nSize = iVar2 + 1;
      vStr->pArray[iVar2] = cVar1 + '0';
      uVar9 = uVar9 - 1;
    } while (1 < (int)uVar9 + 2);
  }
  uVar6 = vStr->nCap;
  if (vStr->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_007d819d;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar8);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar7;
    vStr->nCap = (int)sVar8;
  }
LAB_007d819d:
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  vStr->pArray[iVar2] = ')';
  if (p->pMuxes == (uint *)0x0) {
LAB_007d81fc:
    uVar6 = *(uint *)&pObj->field_0x4;
  }
  else {
    pGVar4 = p->pObjs;
    if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_007d83b8;
    uVar6 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555];
    if ((int)uVar6 < 0) goto LAB_007d83d7;
    if ((uVar6 & 1) == 0) goto LAB_007d81fc;
    uVar6 = (uint)*(undefined8 *)pObj;
  }
  Str_MuxStructDump_rec(p,pObj + -(ulong)(uVar6 & 0x1fffffff),vStr);
  uVar6 = vStr->nCap;
  if (vStr->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_007d827d;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar8);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar7;
    vStr->nCap = (int)sVar8;
  }
LAB_007d827d:
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  vStr->pArray[iVar2] = '|';
  if (p->pMuxes == (uint *)0x0) {
LAB_007d82dc:
    uVar6 = (uint)*(undefined8 *)pObj;
  }
  else {
    pGVar4 = p->pObjs;
    if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) {
LAB_007d83b8:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar6 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555];
    if ((int)uVar6 < 0) {
LAB_007d83d7:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((uVar6 & 1) == 0) goto LAB_007d82dc;
    uVar6 = *(uint *)&pObj->field_0x4;
  }
  Str_MuxStructDump_rec(p,pObj + -(ulong)(uVar6 & 0x1fffffff),vStr);
  uVar6 = vStr->nCap;
  if (vStr->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar6 * 2;
      if ((int)sVar8 <= (int)uVar6) goto LAB_007d8359;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar8);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar7;
    vStr->nCap = (int)sVar8;
  }
LAB_007d8359:
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  vStr->pArray[iVar2] = ']';
  return;
}

Assistant:

void Str_MuxStructDump_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Str_t * vStr )
{
    if ( !pObj->fMark0 )
        return;
    Vec_StrPush( vStr, '[' );
    Vec_StrPush( vStr, '(' );
    Vec_StrPrintNum( vStr, Gia_ObjFaninId2p(p, pObj) );
    Vec_StrPush( vStr, ')' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin0(pObj) : Gia_ObjFanin1(pObj), vStr );
    Vec_StrPush( vStr, '|' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin1(pObj) : Gia_ObjFanin0(pObj), vStr );
    Vec_StrPush( vStr, ']' );
}